

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDIS.cpp
# Opt level: O0

int main(void)

{
  PointRecord1 *this;
  exception *e;
  KOCTET cBuffer [8192];
  allocator<char> local_209;
  KString local_208;
  undefined1 local_1e8 [8];
  Connection conn;
  KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord> local_110;
  undefined1 local_f8 [8];
  WorldCoordinates loc;
  KFLOAT64 GeoZ;
  KFLOAT64 GeoY;
  KFLOAT64 GeoX;
  KFLOAT64 Alt;
  KFLOAT64 Lon;
  KFLOAT64 Lat;
  EntityIdentifier local_88;
  undefined1 local_78 [8];
  Environmental_Process_PDU ourEnvProcPDU;
  
  ourEnvProcPDU.m_vEnvRecords.
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  KDIS::PDU::Environmental_Process_PDU::Environmental_Process_PDU
            ((Environmental_Process_PDU *)local_78);
  KDIS::DATA_TYPE::EntityIdentifier::EntityIdentifier(&local_88,1,0x7b,1);
  KDIS::PDU::Environmental_Process_PDU::SetEnvironmentalProcessID
            ((Environmental_Process_PDU *)local_78,&local_88);
  KDIS::DATA_TYPE::EntityIdentifier::~EntityIdentifier(&local_88);
  KDIS::DATA_TYPE::EnvironmentType::EnvironmentType
            ((EnvironmentType *)&Lat,Air,0,'\x03',SmallSize,'\0','\0');
  KDIS::PDU::Environmental_Process_PDU::SetEnvironmentType
            ((Environmental_Process_PDU *)local_78,(EnvironmentType *)&Lat);
  KDIS::DATA_TYPE::EnvironmentType::~EnvironmentType((EnvironmentType *)&Lat);
  Lon = (KFLOAT64)KDIS::UTILS::DMSToDecimal<double>(51.0,5.0,0.0);
  Alt = (KFLOAT64)KDIS::UTILS::DMSToDecimal<double>(3.0,2.0,0.0);
  GeoX = (KFLOAT64)KDIS::UTILS::FeetToMeters<double>(3000.0);
  GeoY = 0.0;
  GeoZ = 0.0;
  loc.m_f64Z = 0.0;
  KDIS::UTILS::GeodeticToGeocentric<double>
            ((double)Lon,(double)Alt,(double)GeoX,(double *)&GeoY,(double *)&GeoZ,
             (double *)&loc.m_f64Z,WGS_1984);
  KDIS::DATA_TYPE::WorldCoordinates::WorldCoordinates
            ((WorldCoordinates *)local_f8,GeoY,GeoZ,loc.m_f64Z);
  KDIS::PDU::Environmental_Process_PDU::SetEnvironmentStatusOn
            ((Environmental_Process_PDU *)local_78,true);
  KDIS::PDU::Environmental_Process_PDU::SetSequenceNumber
            ((Environmental_Process_PDU *)local_78,0xffff);
  this = (PointRecord1 *)operator_new(0x30);
  KDIS::DATA_TYPE::PointRecord1::PointRecord1(this,'\0',(WorldCoordinates *)local_f8);
  KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::KRef_Ptr
            (&local_110,(EnvironmentRecord *)this);
  KDIS::PDU::Environmental_Process_PDU::AddEnvironmentRecord
            ((Environmental_Process_PDU *)local_78,&local_110);
  KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::~KRef_Ptr(&local_110);
  KDIS::PDU::Header6::SetExerciseID((Header6 *)local_78,'\x01');
  KDIS::DATA_TYPE::TimeStamp::TimeStamp
            ((TimeStamp *)((long)&conn.m_sLastIP.field_2 + 8),RelativeTime,0,true);
  KDIS::PDU::Header6::SetTimeStamp
            ((Header6 *)local_78,(TimeStamp *)((long)&conn.m_sLastIP.field_2 + 8));
  KDIS::DATA_TYPE::TimeStamp::~TimeStamp((TimeStamp *)((long)&conn.m_sLastIP.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"192.168.3.255",&local_209);
  KDIS::NETWORK::Connection::Connection
            ((Connection *)local_1e8,&local_208,3000,false,true,(PDU_Factory *)0x0,false);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  do {
    KDIS::NETWORK::Connection::SendPDU((Connection *)local_1e8,(Header *)local_78);
  } while( true );
}

Assistant:

int main()
{
    // First lets create the PDU object.
    Environmental_Process_PDU ourEnvProcPDU;

    ourEnvProcPDU.SetEnvironmentalProcessID( EntityIdentifier( 1, 123, 1 ) ); // The ID of our application (SiteID, AppID, ObjectID)
    ourEnvProcPDU.SetEnvironmentType( EnvironmentType( Air, 0, 3, SmallSize, 0, 0 ) ); // This value is taken from section 4 of the SISO-REF-010-2006. It represents a small cloud.

    // Convert local coordinate systems to DIS
    // 51.5� N 3.2� W. Cardiff, Wales.
    // A cloud over Wales, what a surprise!
    // Convert Degrees, Minutes, Seconds to decimal and then convert to geocentric.
    KFLOAT64 Lat = KDIS::UTILS::DMSToDecimal( 51.0, 5.0, 0.0 );
    KFLOAT64 Lon = KDIS::UTILS::DMSToDecimal( 3.0, 2.0, 0.0 );
    KFLOAT64 Alt = KDIS::UTILS::FeetToMeters( 3000.0 );
    KFLOAT64 GeoX = 0.0, GeoY = 0.0, GeoZ = 0.0;
    KDIS::UTILS::GeodeticToGeocentric( Lat, Lon, Alt, GeoX, GeoY, GeoZ, WGS_1984 );
    WorldCoordinates loc( GeoX, GeoY, GeoZ );
    ourEnvProcPDU.SetEnvironmentStatusOn( true );
    ourEnvProcPDU.SetSequenceNumber( EP_NO_SEQUENCE );
    ourEnvProcPDU.AddEnvironmentRecord( EnvironmentRecordPtr( new PointRecord1( 0, loc ) ) );

    // Set the PDU Header values
    ourEnvProcPDU.SetExerciseID( 1 );

    // Set the time stamp to automatically calculate.
    ourEnvProcPDU.SetTimeStamp( TimeStamp( RelativeTime, 0, true ) );

    // Note this multi cast address will probably be different for your network.
    Connection conn( "192.168.3.255" );

    KOCTET cBuffer[MAX_PDU_SIZE]; // Somewhere to store the data we send.

    try
    {
        while( true )
        {
            // Keep sending the pdu.
            conn.SendPDU( ( Header * )&ourEnvProcPDU );
        }
    }
    catch( exception & e )
    {
        cout << e.what() << endl;
    }

    return 0;
}